

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O0

void __thiscall
libtorrent::tracker_warning_alert::~tracker_warning_alert(tracker_warning_alert *this)

{
  tracker_warning_alert *this_local;
  
  ~tracker_warning_alert(this);
  operator_delete(this,0xb8);
  return;
}

Assistant:

struct TORRENT_EXPORT tracker_warning_alert final : tracker_alert
	{
		// internal
		tracker_warning_alert(aux::stack_allocator& alloc
			, torrent_handle const& h, tcp::endpoint const& ep
			, string_view u, string_view m);

		TORRENT_DEFINE_ALERT(tracker_warning_alert, 12)

		static constexpr alert_category_t static_category = alert_category::tracker | alert_category::error;
		std::string message() const override;

		// the message associated with this warning
		char const* warning_message() const;

	private:
		aux::allocation_slot m_msg_idx;
#if TORRENT_ABI_VERSION == 1
	public:
		// contains the warning message from the tracker.
		std::string TORRENT_DEPRECATED_MEMBER msg;
#endif
	}